

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantiletobin.cpp
# Opt level: O3

void quantiletobin::doit(bool header)

{
  int iVar1;
  char *pcVar2;
  ulong extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined7 in_register_00000039;
  undefined8 in_R8;
  undefined8 in_R9;
  float quantile;
  char line [4096];
  float local_103c;
  char local_1038 [4104];
  
  if ((int)CONCAT71(in_register_00000039,header) != 0) {
    fgets(local_1038,0x1000,_stdin);
  }
  pcVar2 = fgets(local_1038,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    do {
      while( true ) {
        iVar1 = __isoc99_sscanf(local_1038,"%f",&local_103c);
        if (iVar1 != 1) {
          pcVar2 = local_1038;
          doit();
          fprintf(_stderr,"%s: Segment fault at address: %p\n",progname,
                  *(undefined8 *)(pcVar2 + 0x10),in_R8,in_R9,extraout_RAX_00);
          exit(1);
        }
        if ((1.0 < local_103c) || (local_103c < 0.0)) break;
        fwrite(&local_103c,4,1,_stdout);
        pcVar2 = fgets(local_1038,0x1000,_stdin);
        if (pcVar2 == (char *)0x0) {
          return;
        }
      }
      doit();
    } while ((extraout_RAX & 1) == 0);
  }
  return;
}

Assistant:

void doit(bool header) {

    float quantile;
    char line[4096];
    int lineno = 1;
    if (header) {
      fgets(line, sizeof(line), stdin);   // Skip header line
    }
    lineno++;

    while (fgets(line, sizeof(line), stdin) != 0) {

      if (sscanf(line, "%f", &quantile) != 1) {

	fprintf(stderr, "FATAL: Invalid data in line %d:\n%s\n", lineno, line);
	exit(EXIT_FAILURE);

      } else {
	      
	if (quantile > 1.0 || quantile < 0.0) {
	fprintf(stderr, "FATAL: Invalid quantile %f on line %d", quantile, lineno);
	fprintf(stderr, ": quantiles must lie between 0 and 1 - ignoring...\n");
	continue;
	}

	fwrite(&quantile, sizeof(quantile), 1, stdout);

      }
      lineno++;

    }

  }